

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O2

int Abc_SopGetCubeNum(char *pSop)

{
  int iVar1;
  
  iVar1 = 0;
  if (pSop != (char *)0x0) {
    for (; *pSop != '\0'; pSop = pSop + 1) {
      iVar1 = iVar1 + (uint)(*pSop == '\n');
    }
  }
  return iVar1;
}

Assistant:

int Abc_SopGetCubeNum( char * pSop )
{
    char * pCur;
    int nCubes = 0;
    if ( pSop == NULL )
        return 0;
    for ( pCur = pSop; *pCur; pCur++ )
        nCubes += (*pCur == '\n');
    return nCubes;
}